

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O2

void __thiscall
InlineeFrameInfo::AllocateRecord(InlineeFrameInfo *this,Func *inlinee,intptr_t functionBodyAddr)

{
  char cVar1;
  Type pIVar2;
  code *pcVar3;
  bool bVar4;
  InlineeFrameRecord *pIVar5;
  undefined4 *puVar6;
  Var pvVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ArgList *pAVar11;
  int iVar12;
  uint constantCount;
  long lVar13;
  
  pAVar11 = this->arguments;
  uVar8 = (pAVar11->
          super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
          count;
  lVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar8) {
    uVar10 = (ulong)uVar8;
  }
  iVar12 = 0;
  for (; uVar10 * 0x18 - lVar9 != 0; lVar9 = lVar9 + 0x18) {
    iVar12 = iVar12 + (uint)(*(int *)((long)&((pAVar11->
                                              super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                                              ).buffer)->type + lVar9) == 2);
  }
  constantCount = iVar12 + (uint)((this->function).type == InlineeFrameInfoValueType_Const);
  if (this->record == (InlineeFrameRecord *)0x0) {
    pIVar5 = InlineeFrameRecord::New
                       (&inlinee->topFunc->nativeCodeDataAllocator,uVar8,constantCount,
                        functionBodyAddr,this);
    this->record = pIVar5;
    pAVar11 = this->arguments;
  }
  lVar9 = 8;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar8 = 0;
  for (lVar13 = 0;
      lVar13 < (pAVar11->
               super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>)
               .count; lVar13 = lVar13 + 1) {
    pIVar2 = (pAVar11->
             super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
             buffer;
    iVar12 = *(int *)((long)pIVar2 + lVar9 + -8);
    if (iVar12 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                         ,0x6c,"(value.type != InlineeFrameInfoValueType_None)",
                         "value.type != InlineeFrameInfoValueType_None");
      if (!bVar4) goto LAB_0050f598;
      *puVar6 = 0;
      iVar12 = *(int *)((long)pIVar2 + lVar9 + -8);
    }
    if (iVar12 == 1) {
      iVar12 = *(int *)(*(long *)((long)&pIVar2->type + lVar9) + 0x20) + -0x10;
      if (-1 < iVar12) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                           ,0x76,"(offset < 0)","offset < 0");
        if (!bVar4) goto LAB_0050f598;
        *puVar6 = 0;
      }
      pIVar5 = this->record;
      pIVar5->argOffsets[lVar13] = iVar12;
      cVar1 = *(char *)(*(long *)((long)&pIVar2->type + lVar9) + 0x1c);
      if (cVar1 == '\x03') {
        BVUnitT<unsigned_long>::Set(&pIVar5->losslessInt32Args,(BVIndex)lVar13);
      }
      else if (cVar1 == '\n') {
        BVUnitT<unsigned_long>::Set(&pIVar5->floatArgs,(BVIndex)lVar13);
      }
    }
    else {
      if (constantCount <= uVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                           ,0x84,"(constantIndex < constantCount)","constantIndex < constantCount");
        if (!bVar4) goto LAB_0050f598;
        *puVar6 = 0;
      }
      pvVar7 = BailoutConstantValue::ToVar
                         ((BailoutConstantValue *)((long)&pIVar2->type + lVar9),inlinee);
      this->record->constants[uVar8] = pvVar7;
      this->record->argOffsets[lVar13] = uVar8;
      uVar8 = uVar8 + 1;
    }
    lVar9 = lVar9 + 0x18;
  }
  if ((this->function).type == InlineeFrameInfoValueType_Sym) {
    uVar8 = ((this->function).field_1.sym)->m_offset - 0x10;
  }
  else {
    if ((inlinee->field_0x240 & 2) == 0) {
      return;
    }
    if (constantCount <= uVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                         ,0x9a,"(constantIndex < constantCount)","constantIndex < constantCount");
      if (!bVar4) {
LAB_0050f598:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    pvVar7 = BailoutConstantValue::ToVar(&(this->function).field_1.constValue,inlinee);
    this->record->constants[uVar8] = pvVar7;
  }
  this->record->functionOffset = uVar8;
  return;
}

Assistant:

void InlineeFrameInfo::AllocateRecord(Func* inlinee, intptr_t functionBodyAddr)
{
    uint constantCount = 0;

    // If there are no helper calls there is a chance that frame record is not required after all;
    arguments->Map([&](uint index, InlineFrameInfoValue& value){
        if (value.IsConst())
        {
            constantCount++;
        }
    });

    if (function.IsConst())
    {
        constantCount++;
    }

    // For InlineeEnd's that have been cloned we can result in multiple calls
    // to allocate the record - do not allocate a new record - instead update the existing one.
    // In particular, if the first InlineeEnd resulted in no calls and spills, subsequent might still spill - so it's a good idea to
    // update the record
    if (!this->record)
    {
        this->record = InlineeFrameRecord::New(inlinee->GetNativeCodeDataAllocator(), (uint)arguments->Count(), constantCount, functionBodyAddr, this);
    }

    uint i = 0;
    uint constantIndex = 0;
    arguments->Map([&](uint index, InlineFrameInfoValue& value){
        Assert(value.type != InlineeFrameInfoValueType_None);
        if (value.type == InlineeFrameInfoValueType_Sym)
        {
            int offset;
#ifdef MD_GROW_LOCALS_AREA_UP
            offset = -((int)value.sym->m_offset + BailOutInfo::StackSymBias);
#else
            // Stack offset are negative, includes the PUSH EBP and return address
            offset = value.sym->m_offset - (2 * MachPtr);
#endif
            Assert(offset < 0);
            this->record->argOffsets[i] = offset;
            if (value.sym->IsFloat64())
            {
                this->record->floatArgs.Set(i);
            }
            else if (value.sym->IsInt32())
            {
                this->record->losslessInt32Args.Set(i);
            }
        }
        else
        {
            // Constants
            Assert(constantIndex < constantCount);
            this->record->constants[constantIndex] = value.constValue.ToVar(inlinee);
            this->record->argOffsets[i] = constantIndex;
            constantIndex++;
        }
        i++;
    });

    if (function.type == InlineeFrameInfoValueType_Sym)
    {
        int offset;

#ifdef MD_GROW_LOCALS_AREA_UP
        offset = -((int)function.sym->m_offset + BailOutInfo::StackSymBias);
#else
        // Stack offset are negative, includes the PUSH EBP and return address
        offset = function.sym->m_offset - (2 * MachPtr);
#endif
        this->record->functionOffset = offset;
    }
    else if (inlinee->m_hasInlineArgsOpt)
    {
        Assert(constantIndex < constantCount);
        this->record->constants[constantIndex] = function.constValue.ToVar(inlinee);
        this->record->functionOffset = constantIndex;
    }
}